

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpklite.cc
# Opt level: O2

int explode::unpklite::accept(int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  input *piVar1;
  undefined4 in_register_0000003c;
  ushort local_1c;
  short local_1a;
  
  piVar1 = input_exe_file::file((input_exe_file *)CONCAT44(in_register_0000003c,__fd));
  (*piVar1->_vptr_input[5])(piVar1,0x1e);
  (*piVar1->_vptr_input[2])(piVar1,&local_1c,4);
  return CONCAT31((int3)((local_1c ^ 0x4b50) >> 8),
                  local_1a == 0x494c && (short)(local_1c ^ 0x4b50) == 0);
}

Assistant:

bool unpklite::accept(input_exe_file& inp)
	{
		input& m_file = inp.file();
		static const offset_type pklite_ver_offset = 2 * 0xF;
		m_file.seek(pklite_ver_offset);

		union
		{
			char     bytes[4];
			uint16_t words[2];
		} u;

		m_file.read_buff(u.bytes, 2 * sizeof(uint16_t));

		u.words[0] = byte_order::from_little_endian(u.words[0]);
		u.words[1] = byte_order::from_little_endian(u.words[1]);

		return (u.words[0] == 0x4B50) && (u.words[1] == 0x494C);
	}